

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O0

void Ivy_FraigInsertClass(Ivy_FraigList_t *pList,Ivy_Obj_t *pBase,Ivy_Obj_t *pClass)

{
  Ivy_Obj_t *pIVar1;
  Ivy_Obj_t *pClass_local;
  Ivy_Obj_t *pBase_local;
  Ivy_FraigList_t *pList_local;
  
  Ivy_ObjSetEquivListPrev(pClass,pBase);
  pIVar1 = Ivy_ObjEquivListNext(pBase);
  Ivy_ObjSetEquivListNext(pClass,pIVar1);
  pIVar1 = Ivy_ObjEquivListNext(pBase);
  if (pIVar1 != (Ivy_Obj_t *)0x0) {
    pIVar1 = Ivy_ObjEquivListNext(pBase);
    Ivy_ObjSetEquivListPrev(pIVar1,pClass);
  }
  Ivy_ObjSetEquivListNext(pBase,pClass);
  if (pList->pTail == pBase) {
    pList->pTail = pClass;
  }
  pList->nItems = pList->nItems + 1;
  return;
}

Assistant:

void Ivy_FraigInsertClass( Ivy_FraigList_t * pList, Ivy_Obj_t * pBase, Ivy_Obj_t * pClass )
{
    Ivy_ObjSetEquivListPrev( pClass, pBase );
    Ivy_ObjSetEquivListNext( pClass, Ivy_ObjEquivListNext(pBase) ); 
    if ( Ivy_ObjEquivListNext(pBase) )
        Ivy_ObjSetEquivListPrev( Ivy_ObjEquivListNext(pBase), pClass );
    Ivy_ObjSetEquivListNext( pBase, pClass ); 
    if ( pList->pTail == pBase )
        pList->pTail = pClass;
    pList->nItems++;
}